

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall
SQCompiler::ResolveBreaks(SQCompiler *this,SQFuncState *funcstate,SQInteger ntoresolve)

{
  SQUnsignedInteger SVar1;
  ulong pos;
  long lVar2;
  
  if (0 < ntoresolve) {
    lVar2 = ntoresolve + 1;
    do {
      SVar1 = (funcstate->_unresolvedbreaks)._size;
      pos = (funcstate->_unresolvedbreaks)._vals[SVar1 - 1];
      (funcstate->_unresolvedbreaks)._size = SVar1 - 1;
      SQFuncState::SetIntructionParams(funcstate,pos,0,~pos + (funcstate->_instructions)._size,0,0);
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  return;
}

Assistant:

void ResolveBreaks(SQFuncState *funcstate, SQInteger ntoresolve)
    {
        while(ntoresolve > 0) {
            SQInteger pos = funcstate->_unresolvedbreaks.back();
            funcstate->_unresolvedbreaks.pop_back();
            //set the jmp instruction
            funcstate->SetIntructionParams(pos, 0, funcstate->GetCurrentPos() - pos, 0);
            ntoresolve--;
        }
    }